

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O3

void __thiscall
feintrack::SimpleLeftObjectsDetector::CheckShadyLeftObject
          (SimpleLeftObjectsDetector *this,CTrackingObject *obj)

{
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  _List_node_base *p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  _List_node_base *p_Var11;
  int local_34;
  
  iVar5 = CTrackingObject::get_left_frames(obj);
  if (iVar5 != this->left_object_time0) {
    return;
  }
  uVar2 = obj->uid;
  local_34 = CTrackingObject::get_left_frames(obj);
  iVar5 = CTrackingObject::get_left(obj);
  iVar6 = CTrackingObject::get_right(obj);
  iVar7 = CTrackingObject::get_top(obj);
  iVar8 = CTrackingObject::get_bottom(obj);
  p_Var11 = (this->shady_left_objects).
            super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>.
            _M_impl._M_node.super__List_node_base._M_next;
LAB_00118d25:
  do {
    if (p_Var11 == (_List_node_base *)&this->shady_left_objects) {
      p_Var11 = (_List_node_base *)operator_new(0x30);
      *(int *)&p_Var11[1]._M_next = local_34;
      *(int *)((long)&p_Var11[1]._M_next + 4) = iVar5;
      *(int *)&p_Var11[1]._M_prev = iVar6;
      *(int *)((long)&p_Var11[1]._M_prev + 4) = iVar7;
      *(int *)&p_Var11[2]._M_next = iVar8;
      *(uint *)((long)&p_Var11[2]._M_next + 4) = uVar2;
      *(undefined4 *)&p_Var11[2]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar1 = &(this->shady_left_objects).
                super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      CTrackingObject::set_left_frames(obj,local_34);
      return;
    }
    iVar3 = *(int *)((long)&p_Var11[1]._M_next + 4);
    iVar10 = *(int *)&p_Var11[1]._M_prev;
    iVar9 = CTrackingObject::get_last_center_x(obj);
    iVar9 = (iVar3 + iVar10) / 2 - iVar9;
    iVar3 = -iVar9;
    if (0 < iVar9) {
      iVar3 = iVar9;
    }
    iVar10 = CTrackingObject::get_left_epsilon(obj);
    if (iVar3 < iVar10 * 2) {
      iVar3 = *(int *)((long)&p_Var11[1]._M_prev + 4);
      iVar10 = *(int *)&p_Var11[2]._M_next;
      iVar9 = CTrackingObject::get_last_center_y(obj);
      iVar9 = (iVar3 + iVar10) / 2 - iVar9;
      iVar3 = -iVar9;
      if (0 < iVar9) {
        iVar3 = iVar9;
      }
      iVar10 = CTrackingObject::get_left_epsilon(obj);
      if (iVar3 < iVar10 * 2) {
        local_34 = local_34 + *(int *)&p_Var11[1]._M_next;
        p_Var4 = p_Var11->_M_next;
        psVar1 = &(this->shady_left_objects).
                  super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var11,0x30);
        p_Var11 = p_Var4;
        goto LAB_00118d25;
      }
    }
    p_Var11 = p_Var11->_M_next;
  } while( true );
}

Assistant:

void SimpleLeftObjectsDetector::CheckShadyLeftObject(
        CTrackingObject& obj
        )
{
    if (obj.get_left_frames() == left_object_time0)
    {
        CShadyLeftObj new_obj(obj.uid, obj.get_left_frames(), obj.get_left(), obj.get_right(), obj.get_top(), obj.get_bottom());
        // Если существует объект с центром в некоторой окрестности, то его удаляем а время складываем
        for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
        {
            if ((abs(iter->rect.center_x() - obj.get_last_center_x()) < 2 * obj.get_left_epsilon()) &&
                    (abs(iter->rect.center_y() - obj.get_last_center_y()) < 2 * obj.get_left_epsilon()))
            {
                new_obj.life_time += iter->life_time;
                iter = shady_left_objects.erase(iter);
            }
            else
            {
                ++iter;
            }
        }
        shady_left_objects.push_back(new_obj);
        obj.set_left_frames(new_obj.life_time);
    }
}